

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.hh
# Opt level: O2

bool __thiscall OB::Color::key(Color *this,string *k)

{
  char cVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  const_iterator cVar7;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string *psVar8;
  undefined1 auVar9 [16];
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_88;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_68;
  string local_48;
  
  if (k->_M_string_length == 0) goto LAB_0010f028;
  bVar3 = std::operator==(k,"clear");
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&this->_key);
LAB_0010eeed:
    std::__cxx11::string::assign((char *)&this->_value);
  }
  else {
    bVar3 = std::operator==(k,"reverse");
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&this->_key);
      goto LAB_0010eeed;
    }
    bVar3 = std::operator==(k,"rainbow");
    if (bVar3) {
LAB_0010ef34:
      pcVar5 = (char *)std::__cxx11::string::at((ulong)k);
      cVar1 = *pcVar5;
      if (cVar1 == 'r') {
        TVar2 = rainbow;
LAB_0010ef5a:
        this->_mode = TVar2;
      }
      else {
        if (cVar1 == 'p') {
          TVar2 = party;
          goto LAB_0010ef5a;
        }
        if (cVar1 == 'c') {
          TVar2 = candy;
          goto LAB_0010ef5a;
        }
      }
      std::__cxx11::string::_M_assign((string *)&this->_key);
      lVar6 = random(this);
      auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar9._0_8_ = lVar6;
      auVar9._12_4_ = 0x45300000;
      (this->_hsl).h =
           (auVar9._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      if (this->_fg == true) {
        psVar8 = &local_108;
        hsl_to_hex_abi_cxx11_(psVar8,this,this->_hsl);
        Term::ANSI_Escape_Codes::fg_true(&local_48,psVar8);
      }
      else {
        psVar8 = &local_e8;
        hsl_to_hex_abi_cxx11_(psVar8,this,this->_hsl);
        Term::ANSI_Escape_Codes::bg_true(&local_48,psVar8);
      }
      std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
LAB_0010f01d:
      std::__cxx11::string::~string((string *)psVar8);
    }
    else {
      bVar3 = std::operator==(k,"candy");
      if (bVar3) goto LAB_0010ef34;
      bVar3 = std::operator==(k,"party");
      if (bVar3) goto LAB_0010ef34;
      pcVar5 = (char *)std::__cxx11::string::at((ulong)k);
      if (*pcVar5 != '#') {
LAB_0010f0b4:
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_68,"^[0-9]{1,3}$",0x10);
        bVar3 = String::assert_rx(k,&local_68);
        if (!bVar3) {
LAB_0010f133:
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_68);
LAB_0010f13c:
          cVar7 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&color_fg_abi_cxx11_._M_h,k);
          if (cVar7.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_0010f028;
          std::__cxx11::string::_M_assign((string *)&this->_key);
          this_00 = &color_bg_abi_cxx11_;
          if (this->_fg != false) {
            this_00 = &color_fg_abi_cxx11_;
          }
          std::__detail::
          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)this_00,k);
          std::__cxx11::string::_M_assign((string *)&this->_value);
          goto LAB_0010f025;
        }
        iVar4 = std::__cxx11::stoi(k,(size_t *)0x0,10);
        if (iVar4 < 0) goto LAB_0010f133;
        iVar4 = std::__cxx11::stoi(k,(size_t *)0x0,10);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_68);
        if (0xff < iVar4) goto LAB_0010f13c;
        std::__cxx11::string::_M_assign((string *)&this->_key);
        if (this->_fg == true) {
          Term::ANSI_Escape_Codes::fg_256(&local_48,k);
        }
        else {
          Term::ANSI_Escape_Codes::bg_256(&local_48,k);
        }
        psVar8 = &local_48;
        std::__cxx11::string::operator=((string *)&this->_value,(string *)psVar8);
        goto LAB_0010f01d;
      }
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_88,"^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$",0x10);
      bVar3 = String::assert_rx(k,&local_88);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_88);
      if (!bVar3) goto LAB_0010f0b4;
      std::__cxx11::string::_M_assign((string *)&this->_key);
      if (this->_fg == true) {
        psVar8 = &local_c8;
        std::__cxx11::string::string((string *)psVar8,(string *)k);
        Term::ANSI_Escape_Codes::fg_true(&local_48,psVar8);
      }
      else {
        psVar8 = &local_a8;
        std::__cxx11::string::string((string *)psVar8,(string *)k);
        Term::ANSI_Escape_Codes::bg_true(&local_48,psVar8);
      }
      std::__cxx11::string::operator=((string *)&this->_value,(string *)&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)psVar8);
      hex_to_hsl((HSL *)&local_48,this,k);
      (this->_hsl).l = (double)local_48.field_2._M_allocated_capacity;
      (this->_hsl).h = (double)local_48._M_dataplus._M_p;
      (this->_hsl).s = (double)local_48._M_string_length;
    }
  }
LAB_0010f025:
  this->_valid = true;
LAB_0010f028:
  return this->_valid;
}

Assistant:

bool key(std::string const& k)
  {
    if (! k.empty())
    {
      if (k == "clear")
      {
        // clear
        _key = k;
        _value = "";
        _valid = true;
      }
      else if (k == "reverse")
      {
        // reverse
        _key = k;
        _value = "\x1b[7m";
        _valid = true;
      }
      else if (k == "rainbow" || k == "candy" || k == "party")
      {
        switch(k.at(0))
        {
          case 'r':
          {
            _mode = Mode::rainbow;

            break;
          }

          case 'c':
          {
            _mode = Mode::candy;

            break;
          }

          case 'p':
          {
            _mode = Mode::party;

            break;
          }

          default:
          {
            break;
          }
        }

        _key = k;
        _hsl.h = random(0, 100);
        _value = _fg ? aec::fg_true(hsl_to_hex(_hsl)) :
          aec::bg_true(hsl_to_hex(_hsl));
        _valid = true;
      }
      else
      {
        // 21-bit color
        if (k.at(0) == '#' && OB::String::assert_rx(k,
          std::regex("^#[0-9a-fA-F]{3}(?:[0-9a-fA-F]{3})?$")))
        {
          _key = k;
          _value = _fg ? aec::fg_true(k) : aec::bg_true(k);
          _hsl = hex_to_hsl(k);
          _valid = true;
        }

        // 8-bit color
        else if (OB::String::assert_rx(k, std::regex("^[0-9]{1,3}$")) &&
          std::stoi(k) >= 0 && std::stoi(k) <= 255)
        {
          _key = k;
          _value = _fg ? aec::fg_256(k) : aec::bg_256(k);
          _valid = true;
        }

        // 4-bit color
        else if (color_fg.find(k) != color_fg.end())
        {
          _key = k;

          if (_fg)
          {
            _value = color_fg.at(k);
          }
          else
          {
            _value = color_bg.at(k);
          }

          _valid = true;
        }
      }
    }

    return _valid;
  }